

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O2

VkExtent3D
vkt::synchronization::anon_unknown_0::get2DImageExtentWithSize
          (VkDeviceSize sizeBytes,deUint32 pixelSize)

{
  undefined1 auVar1 [16];
  uint uVar2;
  uint uVar3;
  VkExtent3D VVar4;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = sizeBytes;
  uVar3 = SUB164(auVar1 / ZEXT416(pixelSize),0);
  uVar2 = 0x1000;
  if (uVar3 < 0x1000) {
    uVar2 = uVar3;
  }
  VVar4.height = ((uVar3 >> 0xc) + 1) -
                 (uint)((auVar1 / ZEXT416(pixelSize) & (undefined1  [16])0xfff) ==
                       (undefined1  [16])0x0);
  VVar4.width = uVar2;
  VVar4.depth = 1;
  return VVar4;
}

Assistant:

VkExtent3D get2DImageExtentWithSize (const VkDeviceSize sizeBytes, const deUint32 pixelSize)
{
	const deUint32 size = static_cast<deUint32>(sizeBytes / pixelSize);

	DE_ASSERT(size <= MAX_IMAGE_DIMENSION_2D * MAX_IMAGE_DIMENSION_2D);

	return makeExtent3D(
		std::min(size, static_cast<deUint32>(MAX_IMAGE_DIMENSION_2D)),
		(size / MAX_IMAGE_DIMENSION_2D) + (size % MAX_IMAGE_DIMENSION_2D != 0 ? 1u : 0u),
		1u);
}